

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

wchar_t detect_form(archive_read *a,wchar_t *is_form_d)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  wchar_t wVar6;
  uint uVar7;
  wchar_t wVar8;
  byte *b;
  size_t sVar9;
  void *pvVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  byte *pbVar15;
  byte *pbVar16;
  byte *pbVar17;
  ulong uVar18;
  long len;
  ssize_t sVar19;
  byte *p;
  size_t sVar20;
  size_t unaff_R13;
  bool bVar21;
  ssize_t avail;
  ssize_t nl;
  int local_64;
  size_t local_58;
  int local_4c;
  ulong local_48;
  archive_read *local_40;
  wchar_t *local_38;
  
  if (is_form_d != (wchar_t *)0x0) {
    *is_form_d = L'\0';
  }
  local_40 = a;
  b = (byte *)__archive_read_ahead(a,1,(ssize_t *)&local_58);
  if (b == (byte *)0x0) {
    return L'\xffffffff';
  }
  iVar13 = 0;
  local_64 = 0;
  local_4c = 0;
  sVar20 = local_58;
  local_38 = is_form_d;
LAB_00125e0e:
  do {
    if (local_58 == 0) {
      local_48 = 0;
      sVar9 = 0;
    }
    else {
      sVar9 = get_line_size((char *)b,local_58,(ssize_t *)&local_48);
    }
    bVar21 = false;
    sVar14 = sVar20;
    do {
      sVar3 = local_58;
      sVar20 = sVar14;
      sVar4 = sVar9;
      if (((local_48 != 0) || (sVar9 != local_58)) || (bVar21)) break;
      if ((long)sVar9 < 0x100000) {
        uVar18 = (ulong)((int)sVar14 + 0x3ffU & 0xfffffc00);
        pvVar10 = __archive_read_ahead
                            (local_40,uVar18 << (uVar18 < sVar14 + 0xa0),(ssize_t *)&local_58);
        if (pvVar10 == (void *)0x0) {
          if ((long)local_58 <= (long)sVar14) {
            unaff_R13 = 0;
            b = (byte *)0x0;
            goto LAB_00125e6b;
          }
          pvVar10 = __archive_read_ahead(local_40,local_58,(ssize_t *)&local_58);
          bVar21 = true;
        }
        sVar20 = local_58;
        b = (byte *)((long)pvVar10 + (sVar14 - sVar3));
        local_58 = local_58 - (sVar14 - sVar3);
        sVar19 = get_line_size((char *)(b + sVar9),local_58 - sVar9,(ssize_t *)&local_48);
        sVar14 = 0;
        if (-1 < sVar19) {
          sVar14 = sVar9;
        }
        sVar9 = sVar14 + sVar19;
        bVar2 = true;
      }
      else {
        unaff_R13 = 0xffffffffffffffff;
LAB_00125e6b:
        bVar2 = false;
      }
      sVar14 = sVar20;
      sVar4 = unaff_R13;
    } while (bVar2);
    unaff_R13 = sVar4;
    uVar18 = local_48;
    iVar12 = iVar13;
    if (((long)unaff_R13 < 1) || (local_48 == 0)) goto LAB_001262ba;
    if (local_64 == 0) {
      bVar21 = 0 < (long)unaff_R13;
      if (0 < (long)unaff_R13) {
        pbVar17 = b + unaff_R13;
        do {
          sVar9 = local_58 - 1;
          if ((*b != 0x20) && (*b != 9)) goto LAB_00125f82;
          b = b + 1;
          bVar21 = 1 < (long)unaff_R13;
          bVar2 = 1 < (long)unaff_R13;
          unaff_R13 = unaff_R13 - 1;
          local_58 = sVar9;
        } while (bVar2);
        unaff_R13 = 0;
        b = pbVar17;
      }
LAB_00125f82:
      bVar1 = *b;
      if (bVar1 < 0x23) {
        if ((bVar1 == 10) || (bVar1 == 0xd)) goto LAB_00125f9e;
LAB_00126084:
        pbVar17 = b + unaff_R13;
        wVar6 = L'\0';
        bVar2 = false;
        p = b;
        if (bVar21) {
          uVar11 = (ulong)*b;
          if (bid_entry_safe_char[uVar11] == '\0') {
            bVar2 = false;
          }
          else {
            do {
              p = p + 1;
              if (pbVar17 <= p) {
                bVar2 = true;
                goto LAB_00126129;
              }
              uVar11 = (ulong)*p;
            } while (bid_entry_safe_char[uVar11] != '\0');
            bVar2 = true;
          }
          if ((0x20 < (byte)uVar11) || ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0)) {
            bVar2 = false;
          }
        }
LAB_00126129:
        sVar19 = (long)pbVar17 - (long)p;
        if (bVar2) {
LAB_00126223:
          wVar8 = bid_keyword_list((char *)p,sVar19,L'\0',wVar6);
        }
        else {
          pbVar16 = pbVar17 + -local_48;
          if (((pbVar17 + -local_48 + -2 < b) || (pbVar16[-1] != 0x5c)) ||
             ((bVar1 = pbVar17[-local_48 + -2], bVar1 != 9 && (bVar1 != 0x20)))) {
            pbVar15 = pbVar16 + -1;
            bVar21 = true;
            if (pbVar15 < b) {
              uVar7 = 0;
LAB_0012617c:
              if ((uVar7 == 0) || (bVar21)) goto LAB_00126216;
              wVar6 = L'\0';
              bVar2 = false;
              if (*pbVar16 != 0x2f) {
                sVar19 = unaff_R13 - (uVar7 + local_48);
                bVar2 = true;
                wVar6 = L'\x01';
                p = b;
              }
            }
            else {
              bVar2 = false;
              if (*pbVar15 != 0x5c) {
                uVar7 = 0;
                if (b <= pbVar15) {
                  bVar21 = false;
                  uVar7 = 0;
                  do {
                    bVar1 = *pbVar15;
                    if ((bVar1 == 9) || (bVar1 == 0x20)) break;
                    if (bid_entry_safe_char[bVar1] == '\0') goto LAB_00126216;
                    uVar7 = uVar7 + 1;
                    if (bVar1 == 0x2f) {
                      bVar21 = true;
                    }
                    pbVar15 = pbVar15 + -1;
                  } while (b <= pbVar15);
                  pbVar16 = pbVar15 + 1;
                  bVar21 = !bVar21;
                }
                goto LAB_0012617c;
              }
              wVar6 = L'\0';
            }
          }
          else {
LAB_00126216:
            wVar6 = L'\0';
            bVar2 = false;
          }
          wVar8 = L'\xffffffff';
          if (bVar2) goto LAB_00126223;
        }
        if (wVar8 < L'\0') {
LAB_0012626b:
          bVar21 = false;
        }
        else {
          if (local_4c == 1) {
            local_4c = 1;
            if ((wVar6 == L'\0') && (wVar8 != L'\0')) goto LAB_0012626b;
          }
          else if ((local_4c == 0) && (local_4c = 1, wVar6 == L'\0')) {
            local_4c = -(uint)(wVar8 != L'\0');
          }
          if ((wVar6 == L'\0') && (pbVar17[~uVar18] == 0x5c)) {
            bVar21 = true;
            local_64 = 1;
          }
          else {
            bVar21 = iVar13 < 2;
            iVar12 = iVar13 + 1;
          }
        }
        iVar13 = iVar12;
        if (!bVar21) goto LAB_001262ba;
      }
      else if (bVar1 != 0x23) {
        if (bVar1 != 0x2f) goto LAB_00126084;
        if (((long)unaff_R13 < 5) || (iVar5 = strncmp((char *)b,"/set",4), iVar5 != 0)) {
          if ((long)unaff_R13 < 7) goto LAB_001262ba;
          iVar5 = strncmp((char *)b,"/unset",6);
          if (iVar5 == 0) {
            pbVar17 = b + 6;
            len = unaff_R13 - 6;
            wVar6 = L'\x01';
            goto LAB_00126044;
          }
        }
        else {
          pbVar17 = b + 4;
          len = unaff_R13 - 4;
          wVar6 = L'\0';
LAB_00126044:
          wVar6 = bid_keyword_list((char *)pbVar17,len,wVar6,L'\0');
          if (L'\0' < wVar6) {
            if (b[~uVar18 + unaff_R13] == 0x5c) {
              local_64 = 2;
            }
            goto LAB_00125f9e;
          }
        }
        unaff_R13 = 1;
LAB_001262ba:
        if (iVar12 < 3) {
          if (unaff_R13 != 0) {
            return L'\0';
          }
          if (iVar12 < 1) {
            return L'\0';
          }
        }
        if (local_38 == (wchar_t *)0x0) {
          return L' ';
        }
        if (local_4c != 1) {
          return L' ';
        }
        *local_38 = L'\x01';
        return L' ';
      }
LAB_00125f9e:
      b = b + unaff_R13;
      local_58 = local_58 - unaff_R13;
      goto LAB_00125e0e;
    }
    wVar6 = bid_keyword_list((char *)b,unaff_R13,L'\0',L'\0');
    if ((wVar6 < L'\x01') ||
       (((b = b + unaff_R13, b[~uVar18] != 0x5c && (bVar21 = local_64 == 1, local_64 = 0, bVar21))
        && (iVar12 = iVar13 + 1, bVar21 = 1 < iVar13, iVar13 = iVar12, bVar21)))) goto LAB_001262ba;
    local_58 = local_58 - unaff_R13;
  } while( true );
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is an mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (len > 4 && strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (len > 6 && strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}